

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-reader.c
# Opt level: O0

int labpack_read_int(labpack_reader_t *reader)

{
  _Bool _Var1;
  int local_14;
  int value;
  labpack_reader_t *reader_local;
  
  if (reader == (labpack_reader_t *)0x0) {
    __assert_fail("reader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-reader.c"
                  ,0x100,"int labpack_read_int(labpack_reader_t *)");
  }
  local_14 = 0;
  _Var1 = labpack_reader_is_ok(reader);
  if (_Var1) {
    local_14 = mpack_expect_int(reader->decoder);
    labpack_reader_check_decoder(reader);
  }
  return local_14;
}

Assistant:

int
labpack_read_int(labpack_reader_t* reader)
{
    assert(reader);
    int value = 0;
    if (labpack_reader_is_ok(reader)) {
        value = mpack_expect_int(reader->decoder);
        labpack_reader_check_decoder(reader);
    }
    return value;
}